

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::OnIf(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Type *pTVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  Type *pTVar5;
  unsigned_long local_40;
  LabelType local_34;
  
  RVar2 = PopAndCheck1Type(this,I32,"if");
  RVar3 = PopAndCheckSignature(this,param_types,"if");
  local_34 = If;
  local_40 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
  std::vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>>::
  emplace_back<wabt::LabelType&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,unsigned_long>
            ((vector<wabt::TypeChecker::Label,std::allocator<wabt::TypeChecker::Label>> *)
             &this->label_stack_,&local_34,param_types,result_types,&local_40);
  pTVar1 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar5 = (param_types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar5 != pTVar1; pTVar5 = pTVar5 + 1) {
    PushType(this,*pTVar5);
  }
  RVar4.enum_._1_3_ = 0;
  RVar4.enum_._0_1_ = RVar3.enum_ == Error || RVar2.enum_ == Error;
  return (Result)RVar4.enum_;
}

Assistant:

Result TypeChecker::OnIf(const TypeVector& param_types,
                         const TypeVector& result_types) {
  Result result = PopAndCheck1Type(Type::I32, "if");
  result |= PopAndCheckSignature(param_types, "if");
  PushLabel(LabelType::If, param_types, result_types);
  PushTypes(param_types);
  return result;
}